

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCInst.c
# Opt level: O3

void MCInst_insert0(MCInst *inst,int index,MCOperand *Op)

{
  MCOperand *pMVar1;
  byte bVar2;
  undefined8 uVar3;
  anon_union_8_3_2f11d3b5_for_MCOperand_3 aVar4;
  uchar uVar5;
  undefined3 uVar6;
  ulong uVar7;
  ulong uVar8;
  MCInst *pMVar9;
  
  bVar2 = inst->size;
  uVar8 = (ulong)bVar2;
  if (index < (int)(uint)bVar2) {
    uVar7 = (ulong)index;
    pMVar9 = (MCInst *)(inst->Operands + bVar2);
    do {
      uVar8 = uVar8 - 1;
      uVar3 = *(undefined8 *)((long)(pMVar9 + 0xffffffffffffffff) + 0x350);
      aVar4 = *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)
               ((long)(pMVar9 + 0xffffffffffffffff) + 0x358);
      pMVar9->OpcodePub = (int)uVar3;
      pMVar9->size = (char)((ulong)uVar3 >> 0x20);
      pMVar9->has_imm = (_Bool)(char)((ulong)uVar3 >> 0x28);
      pMVar9->op1_size = (char)((ulong)uVar3 >> 0x30);
      pMVar9->field_0x7 = (char)((ulong)uVar3 >> 0x38);
      *(anon_union_8_3_2f11d3b5_for_MCOperand_3 *)&pMVar9->Opcode = aVar4;
      pMVar9 = (MCInst *)((long)(pMVar9 + 0xffffffffffffffff) + 0x350);
    } while ((long)uVar7 < (long)uVar8);
  }
  else {
    uVar7 = (ulong)(uint)index;
  }
  uVar5 = Op->Kind;
  uVar6 = *(undefined3 *)&Op->field_0x5;
  aVar4 = Op->field_2;
  pMVar1 = inst->Operands + uVar7;
  pMVar1->MachineOperandType = Op->MachineOperandType;
  pMVar1->Kind = uVar5;
  *(undefined3 *)&pMVar1->field_0x5 = uVar6;
  pMVar1->field_2 = aVar4;
  inst->size = inst->size + '\x01';
  return;
}

Assistant:

void MCInst_insert0(MCInst *inst, int index, MCOperand *Op)
{
	int i;

	for(i = inst->size; i > index; i--)
		//memcpy(&(inst->Operands[i]), &(inst->Operands[i-1]), sizeof(MCOperand));
		inst->Operands[i] = inst->Operands[i-1];

	inst->Operands[index] = *Op;
	inst->size++;
}